

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::addProperty(SimInfo *this,shared_ptr<OpenMD::GenericData> *genData)

{
  long in_RDI;
  shared_ptr<OpenMD::GenericData> *in_stack_000000a8;
  PropertyMap *in_stack_000000b0;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffffb8;
  
  std::shared_ptr<OpenMD::GenericData>::shared_ptr
            ((shared_ptr<OpenMD::GenericData> *)(in_RDI + 0x2c0),in_stack_ffffffffffffffb8);
  PropertyMap::addProperty(in_stack_000000b0,in_stack_000000a8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x159528);
  return;
}

Assistant:

void SimInfo::addProperty(std::shared_ptr<GenericData> genData) {
    properties_.addProperty(genData);
  }